

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O3

void test_bin_ext(fitsfile *infits,FILE *out,FitsHdu *hduptr)

{
  int iVar1;
  FitsKey **ppFVar2;
  FitsKey *pFVar3;
  double dVar4;
  char **ppcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  ushort **ppuVar10;
  size_t sVar11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ushort **ppuVar21;
  int iVar22;
  void *pvVar23;
  size_t sVar24;
  long lVar25;
  int status;
  int datatype;
  int ntdim;
  long tdim [10];
  int local_ac;
  ushort **local_a8;
  int local_9c;
  fitsfile *local_98;
  undefined1 local_8c [4];
  undefined1 local_88 [88];
  
  local_ac = 0;
  ppFVar2 = hduptr->kwds;
  iVar1 = hduptr->tkeys;
  sVar24 = (size_t)iVar1;
  uVar17 = hduptr->ncols;
  local_98 = infits;
  test_ext(infits,out,hduptr);
  test_tbl(infits,out,hduptr);
  ppcVar5 = tmpkwds;
  builtin_strncpy(temp,"TNULL",6);
  ptemp = temp;
  pvVar9 = bsearch(&ptemp,tmpkwds,sVar24,8,compstrp);
  if (pvVar9 != (void *)0x0) {
    uVar20 = (ulong)((long)pvVar9 - (long)ppcVar5) >> 3;
    iVar8 = (int)uVar20;
    if (iVar8 < 2) {
      uVar20 = 1;
    }
    else {
      uVar15 = 1;
      uVar18 = uVar20 & 0xffffffff;
      pvVar23 = pvVar9;
      do {
        iVar8 = (int)uVar18;
        pvVar23 = (void *)((long)pvVar23 + -8);
        iVar6 = compstrp(&ptemp,pvVar23);
        if (iVar6 != 0) {
          uVar20 = (ulong)uVar15;
          goto LAB_0010b2d1;
        }
        uVar18 = (ulong)(iVar8 - 1U);
        uVar15 = uVar15 + 1;
      } while (iVar8 - 1U != 1);
      iVar8 = 1;
    }
LAB_0010b2d1:
    iVar6 = (int)uVar20;
    if ((int)uVar20 + iVar8 < iVar1) {
      do {
        iVar22 = (int)uVar20;
        pvVar9 = (void *)((long)pvVar9 + 8);
        iVar7 = compstrp(&ptemp,pvVar9);
        iVar6 = iVar22;
        if (iVar7 != 0) break;
        uVar20 = (ulong)(iVar22 + 1);
        iVar6 = iVar1 - iVar8;
      } while (iVar22 + iVar8 + 1 < iVar1);
    }
    if (0 < iVar6) {
      ppuVar10 = __ctype_b_loc();
      lVar25 = (long)iVar8;
      ppuVar21 = (ushort **)(long)(iVar6 + iVar8);
      local_a8 = ppuVar21;
      do {
        pFVar3 = ppFVar2[lVar25];
        if ((*(byte *)((long)*ppuVar10 + (long)pFVar3->kname[5] * 2 + 1) & 8) != 0) {
          check_int(pFVar3,out);
          uVar20 = strtol(pFVar3->kname + 5,(char **)0x0,10);
          iVar8 = (int)uVar20;
          if ((int)uVar17 < iVar8 || iVar8 < 1) {
            sprintf(errmes,"Keyword #%d, %s: invalid index %d (> TFIELD = %d).",
                    (ulong)(uint)ppFVar2[lVar25]->kindex,ppFVar2[lVar25],uVar20 & 0xffffffff);
            wrterr(out,errmes,1);
            ppuVar21 = local_a8;
          }
          else {
            uVar15 = iVar8 - 1;
            pcVar12 = tform[uVar15];
            pcVar13 = strchr(pcVar12,0x42);
            if ((((pcVar13 == (char *)0x0) &&
                 (pcVar13 = strchr(pcVar12,0x49), pcVar13 == (char *)0x0)) &&
                (pcVar13 = strchr(pcVar12,0x4a), pcVar13 == (char *)0x0)) &&
               (pcVar13 = strchr(pcVar12,0x4b), pcVar13 == (char *)0x0)) {
              sprintf(errmes,"Keyword #%d, %s is used for the column with format \"%s \".",
                      (ulong)(uint)ppFVar2[lVar25]->kindex,ppFVar2[lVar25],pcVar12);
              wrterr(out,errmes,2);
            }
            uVar20 = strtol(ppFVar2[lVar25]->kvalue,(char **)0x0,10);
            pcVar12 = strchr(tform[uVar15],0x42);
            if ((pcVar12 != (char *)0x0) && (0xff < uVar20)) {
              sprintf(errmes,"Keyword #%d, %s: The value %ld",(ulong)(uint)ppFVar2[lVar25]->kindex,
                      ppFVar2[lVar25],uVar20);
              sVar11 = strlen(errmes);
              builtin_strncpy(errmes + sVar11," is not ",8);
              builtin_strncpy(errmes + sVar11 + 8,"in the r",8);
              builtin_strncpy(errmes + sVar11 + 0x10,"ange of ",8);
              builtin_strncpy(errmes + sVar11 + 0x18,"datatype",8);
              builtin_strncpy(errmes + sVar11 + 0x20," B.",4);
              wrtwrn(out,errmes,0);
            }
            lVar14 = strtol(ppFVar2[lVar25]->kvalue,(char **)0x0,10);
            pcVar12 = strchr(tform[uVar15],0x49);
            ppuVar21 = local_a8;
            if ((pcVar12 != (char *)0x0) && (lVar14 - 0x8000U < 0xffffffffffff0000)) {
              sprintf(errmes,"Keyword #%d, %s: The value %ld",(ulong)(uint)ppFVar2[lVar25]->kindex,
                      ppFVar2[lVar25],lVar14);
              sVar11 = strlen(errmes);
              builtin_strncpy(errmes + sVar11," is not ",8);
              builtin_strncpy(errmes + sVar11 + 8,"in the r",8);
              builtin_strncpy(errmes + sVar11 + 0x10,"ange of ",8);
              builtin_strncpy(errmes + sVar11 + 0x18,"datatype",8);
              builtin_strncpy(errmes + sVar11 + 0x20," I ",4);
              wrtwrn(out,errmes,0);
            }
          }
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 < (long)ppuVar21);
    }
  }
  ppcVar5 = tmpkwds;
  builtin_strncpy(temp,"TSCAL",6);
  ptemp = temp;
  pvVar9 = bsearch(&ptemp,tmpkwds,sVar24,8,compstrp);
  if (pvVar9 != (void *)0x0) {
    uVar20 = (ulong)((long)pvVar9 - (long)ppcVar5) >> 3;
    iVar8 = (int)uVar20;
    if (iVar8 < 2) {
      uVar20 = 1;
    }
    else {
      uVar15 = 1;
      uVar18 = uVar20 & 0xffffffff;
      pvVar23 = pvVar9;
      do {
        iVar8 = (int)uVar18;
        pvVar23 = (void *)((long)pvVar23 + -8);
        iVar6 = compstrp(&ptemp,pvVar23);
        if (iVar6 != 0) {
          uVar20 = (ulong)uVar15;
          goto LAB_0010b67b;
        }
        uVar18 = (ulong)(iVar8 - 1U);
        uVar15 = uVar15 + 1;
      } while (iVar8 - 1U != 1);
      iVar8 = 1;
    }
LAB_0010b67b:
    iVar6 = (int)uVar20;
    if ((int)uVar20 + iVar8 < iVar1) {
      do {
        iVar22 = (int)uVar20;
        pvVar9 = (void *)((long)pvVar9 + 8);
        iVar7 = compstrp(&ptemp,pvVar9);
        iVar6 = iVar22;
        if (iVar7 != 0) break;
        uVar20 = (ulong)(iVar22 + 1);
        iVar6 = iVar1 - iVar8;
      } while (iVar8 + 1 + iVar22 < iVar1);
    }
    if (0 < iVar6) {
      ppuVar21 = __ctype_b_loc();
      lVar25 = (long)iVar8;
      do {
        pFVar3 = ppFVar2[lVar25];
        if ((*(byte *)((long)*ppuVar21 + (long)pFVar3->kname[5] * 2 + 1) & 8) != 0) {
          iVar7 = check_flt(pFVar3,out);
          if (iVar7 != 0) {
            dVar4 = strtod(ppFVar2[lVar25]->kvalue,(char **)0x0);
            if ((dVar4 == 0.0) && (!NAN(dVar4))) {
              sprintf(errmes,"Keyword #%d, %s:",(ulong)(uint)ppFVar2[lVar25]->kindex);
              sVar11 = strlen(errmes);
              builtin_strncpy(errmes + sVar11,"The scal",8);
              builtin_strncpy(errmes + sVar11 + 8,"ing fact",8);
              builtin_strncpy(errmes + sVar11 + 0xc,"factor i",8);
              builtin_strncpy(errmes + sVar11 + 0x14,"s zero.",8);
              wrtwrn(out,errmes,0);
            }
          }
          uVar20 = strtol(pFVar3->kname + 5,(char **)0x0,10);
          iVar7 = (int)uVar20;
          if ((int)uVar17 < iVar7 || iVar7 < 1) {
            sprintf(errmes,"Keyword #%d, %s: invalid index %d (> TFIELD = %d).",
                    (ulong)(uint)ppFVar2[lVar25]->kindex,ppFVar2[lVar25],uVar20 & 0xffffffff);
          }
          else {
            pcVar12 = tform[iVar7 - 1];
            pcVar13 = strchr(pcVar12,0x41);
            if (((pcVar13 == (char *)0x0) &&
                (pcVar13 = strchr(pcVar12,0x4c), pcVar13 == (char *)0x0)) &&
               (pcVar12 = strchr(pcVar12,0x58), pcVar12 == (char *)0x0)) goto LAB_0010b851;
            sprintf(errmes,"Keyword #%d, %s is used in A, L, or X column. ",
                    (ulong)(uint)ppFVar2[lVar25]->kindex);
          }
          wrterr(out,errmes,1);
        }
LAB_0010b851:
        lVar25 = lVar25 + 1;
      } while (lVar25 < iVar6 + iVar8);
    }
  }
  ppcVar5 = tmpkwds;
  builtin_strncpy(temp,"TZERO",6);
  ptemp = temp;
  pvVar9 = bsearch(&ptemp,tmpkwds,sVar24,8,compstrp);
  if (pvVar9 != (void *)0x0) {
    uVar20 = (ulong)((long)pvVar9 - (long)ppcVar5) >> 3;
    iVar8 = (int)uVar20;
    if (iVar8 < 2) {
      uVar20 = 1;
    }
    else {
      uVar15 = 1;
      uVar18 = uVar20 & 0xffffffff;
      pvVar23 = pvVar9;
      do {
        iVar8 = (int)uVar18;
        pvVar23 = (void *)((long)pvVar23 + -8);
        iVar6 = compstrp(&ptemp,pvVar23);
        if (iVar6 != 0) {
          uVar20 = (ulong)uVar15;
          goto LAB_0010b908;
        }
        uVar18 = (ulong)(iVar8 - 1U);
        uVar15 = uVar15 + 1;
      } while (iVar8 - 1U != 1);
      iVar8 = 1;
    }
LAB_0010b908:
    iVar6 = (int)uVar20;
    if ((int)uVar20 + iVar8 < iVar1) {
      do {
        iVar22 = (int)uVar20;
        pvVar9 = (void *)((long)pvVar9 + 8);
        iVar7 = compstrp(&ptemp,pvVar9);
        iVar6 = iVar22;
        if (iVar7 != 0) break;
        uVar20 = (ulong)(iVar22 + 1);
        iVar6 = iVar1 - iVar8;
      } while (iVar22 + iVar8 + 1 < iVar1);
    }
    if (0 < iVar6) {
      ppuVar21 = __ctype_b_loc();
      lVar25 = (long)iVar8;
      do {
        pFVar3 = ppFVar2[lVar25];
        if ((*(byte *)((long)*ppuVar21 + (long)pFVar3->kname[5] * 2 + 1) & 8) != 0) {
          check_flt(pFVar3,out);
          uVar20 = strtol(pFVar3->kname + 5,(char **)0x0,10);
          iVar7 = (int)uVar20;
          if ((int)uVar17 < iVar7 || iVar7 < 1) {
            sprintf(errmes,"Keyword #%d, %s: invalid index %d (> TFIELD = %d).",
                    (ulong)(uint)ppFVar2[lVar25]->kindex,ppFVar2[lVar25],uVar20 & 0xffffffff);
          }
          else {
            pcVar12 = tform[iVar7 - 1];
            pcVar13 = strchr(pcVar12,0x41);
            if (((pcVar13 == (char *)0x0) ||
                (pcVar13 = strchr(pcVar12,0x4c), pcVar13 == (char *)0x0)) ||
               (pcVar12 = strchr(pcVar12,0x58), pcVar12 == (char *)0x0)) goto LAB_0010ba65;
            sprintf(errmes,"Keyword #%d, %s is used in A, L, or X column. ",
                    (ulong)(uint)ppFVar2[lVar25]->kindex);
          }
          wrterr(out,errmes,1);
        }
LAB_0010ba65:
        lVar25 = lVar25 + 1;
      } while (lVar25 < iVar6 + iVar8);
    }
  }
  hduptr->heap = (int)hduptr->naxes[1] * (int)*hduptr->naxes;
  ppcVar5 = tmpkwds;
  builtin_strncpy(temp,"THEAP",6);
  pvVar9 = bsearch(&ptemp,tmpkwds,sVar24,8,compstre);
  if (pvVar9 != (void *)0x0) {
    uVar20 = (ulong)((long)pvVar9 - (long)ppcVar5) >> 3;
    uVar15 = (uint)uVar20;
    if ((int)uVar15 < 2) {
      uVar19 = uVar15;
      uVar16 = 1;
    }
    else {
      uVar16 = 1;
      uVar20 = uVar20 & 0xffffffff;
      pvVar23 = pvVar9;
      do {
        pvVar23 = (void *)((long)pvVar23 + -8);
        uVar19 = (uint)uVar20;
        iVar8 = compstre(&ptemp,pvVar23);
        if (iVar8 != 0) goto LAB_0010bb35;
        uVar20 = (ulong)(uVar19 - 1);
        uVar16 = uVar16 + 1;
      } while (uVar19 - 1 != 1);
      uVar19 = 1;
      uVar16 = uVar15;
    }
LAB_0010bb35:
    if ((int)(uVar19 + uVar16) < iVar1) {
      iVar8 = uVar19 + uVar16;
      do {
        iVar8 = iVar8 + 1;
        pvVar9 = (void *)((long)pvVar9 + 8);
        iVar6 = compstre(&ptemp,pvVar9);
        if (iVar6 != 0) break;
      } while (iVar8 < iVar1);
    }
    if (-1 < (int)uVar19) {
      iVar8 = check_int(ppFVar2[uVar19],out);
      if (iVar8 != 0) {
        lVar25 = strtol(hduptr->kwds[uVar19]->kvalue,(char **)0x0,10);
        hduptr->heap = (int)lVar25;
      }
      if (hduptr->pcount == 0) {
        sprintf(errmes,"Pcount is zero, but keyword THEAP is present at record #%d). ",
                (ulong)(uint)ppFVar2[uVar19]->kindex);
        wrterr(out,errmes,1);
      }
    }
  }
  if (hduptr->pcount != 0) {
    uVar15 = 0;
    if (0 < (int)uVar17) {
      uVar15 = uVar17;
    }
    uVar19 = 0;
    do {
      if (uVar15 == uVar19) {
        sprintf(errmes,"PCOUNT = %ld, but there are no variable-length array columns.",
                hduptr->pcount);
        wrtwrn(out,errmes,0);
        break;
      }
      iVar8 = ffgtcl(local_98,uVar19 + 1,&local_9c,0,0,&local_ac);
      if (iVar8 != 0) {
        sprintf(errmes,"Column #%d: ",(ulong)uVar19);
        wrtferr(out,errmes,&local_ac,2);
      }
      uVar19 = uVar19 + 1;
    } while (-1 < local_9c);
  }
  ppcVar5 = tmpkwds;
  temp._4_2_ = temp._4_2_ & 0xff00;
  builtin_strncpy(temp,"TDIM",4);
  pvVar9 = bsearch(&ptemp,tmpkwds,sVar24,8,compstrp);
  if (pvVar9 != (void *)0x0) {
    uVar20 = (ulong)((long)pvVar9 - (long)ppcVar5) >> 3;
    iVar8 = (int)uVar20;
    if (iVar8 < 2) {
      uVar20 = 1;
    }
    else {
      uVar15 = 1;
      uVar18 = uVar20 & 0xffffffff;
      pvVar23 = pvVar9;
      do {
        iVar8 = (int)uVar18;
        pvVar23 = (void *)((long)pvVar23 + -8);
        iVar6 = compstrp(&ptemp,pvVar23);
        if (iVar6 != 0) {
          uVar20 = (ulong)uVar15;
          goto LAB_0010bd5c;
        }
        uVar18 = (ulong)(iVar8 - 1U);
        uVar15 = uVar15 + 1;
      } while (iVar8 - 1U != 1);
      iVar8 = 1;
    }
LAB_0010bd5c:
    iVar6 = (int)uVar20;
    if ((int)uVar20 + iVar8 < iVar1) {
      do {
        iVar22 = (int)uVar20;
        pvVar9 = (void *)((long)pvVar9 + 8);
        iVar7 = compstrp(&ptemp,pvVar9);
        iVar6 = iVar22;
        if (iVar7 != 0) break;
        uVar20 = (ulong)(iVar22 + 1);
        iVar6 = iVar1 - iVar8;
      } while (iVar22 + iVar8 + 1 < iVar1);
    }
    if (0 < iVar6) {
      ppuVar21 = __ctype_b_loc();
      lVar25 = (long)iVar8;
      local_a8 = ppuVar21;
      do {
        pFVar3 = ppFVar2[lVar25];
        if ((*(byte *)((long)*ppuVar21 + (long)pFVar3->kname[4] * 2 + 1) & 8) != 0) {
          check_str(pFVar3,out);
          if (pFVar3->kvalue[0] == ' ') {
            sprintf(errmes,"Keyword #%d, %s: TDIM=\"%s\" ",(ulong)(uint)pFVar3->kindex,pFVar3,
                    pFVar3->kvalue);
            sVar11 = strlen(errmes);
            builtin_strncpy(errmes + sVar11,"should n",8);
            builtin_strncpy(errmes + sVar11 + 8,"ot have ",8);
            builtin_strncpy(errmes + sVar11 + 0xf," leading",8);
            builtin_strncpy(errmes + sVar11 + 0x17," space.",8);
          }
          else {
            uVar20 = strtol(pFVar3->kname + 4,(char **)0x0,10);
            if ((int)uVar20 <= (int)uVar17 && 0 < (int)uVar20) {
              iVar7 = ffdtdm(local_98,pFVar3->kvalue,uVar20 & 0xffffffff,10,local_8c,local_88,
                             &local_ac);
              if (iVar7 != 0) {
                sprintf(errmes,"Keyword #%d, %s: ",(ulong)(uint)ppFVar2[lVar25]->kindex);
                ppuVar21 = local_a8;
                wrtferr(out,errmes,&local_ac,1);
              }
              goto LAB_0010beb0;
            }
            sprintf(errmes,"Keyword #%d, %s: invalid index %d (> TFIELD = %d).",
                    (ulong)(uint)ppFVar2[lVar25]->kindex,ppFVar2[lVar25],uVar20 & 0xffffffff);
          }
          ppuVar21 = local_a8;
          wrterr(out,errmes,1);
        }
LAB_0010beb0:
        lVar25 = lVar25 + 1;
      } while (lVar25 < iVar6 + iVar8);
    }
  }
  if (0 < hduptr->ncols) {
    lVar25 = 0;
    do {
      pcVar12 = tform[lVar25];
      pcVar13 = strchr(pcVar12,0x41);
      if (pcVar13 != (char *)0x0) {
        uVar20 = strtol(pcVar12,(char **)0x0,10);
        ppuVar21 = __ctype_b_loc();
        if (((*(byte *)((long)*ppuVar21 + (long)pcVar13[1] * 2 + 1) & 8) != 0) &&
           (lVar14 = strtol(pcVar13 + 1,(char **)0x0,10),
           (int)((long)((ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | uVar20 & 0xffffffff) %
                (long)(int)lVar14) != 0)) {
          sprintf(errmes,"TFORM %s of column %d: repeat %d is not the multiple of the width %d",
                  tform[lVar25],(ulong)((int)lVar25 + 1),uVar20 & 0xffffffff);
          wrtwrn(out,errmes,0);
        }
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 < hduptr->ncols);
  }
  ppcVar5 = tmpkwds;
  builtin_strncpy(temp,"TBCOL",6);
  ptemp = temp;
  pvVar9 = bsearch(&ptemp,tmpkwds,sVar24,8,compstrp);
  if (pvVar9 != (void *)0x0) {
    uVar20 = (ulong)((long)pvVar9 - (long)ppcVar5) >> 3;
    uVar17 = (uint)uVar20;
    if ((int)uVar17 < 2) {
      uVar20 = 1;
    }
    else {
      uVar15 = 1;
      uVar18 = uVar20 & 0xffffffff;
      pvVar23 = pvVar9;
      do {
        uVar17 = (uint)uVar18;
        pvVar23 = (void *)((long)pvVar23 + -8);
        iVar8 = compstrp(&ptemp,pvVar23);
        if (iVar8 != 0) {
          uVar20 = (ulong)uVar15;
          goto LAB_0010c0ae;
        }
        uVar18 = (ulong)(uVar17 - 1);
        uVar15 = uVar15 + 1;
      } while (uVar17 - 1 != 1);
      uVar17 = 1;
    }
LAB_0010c0ae:
    iVar8 = (int)uVar20;
    if ((int)(uVar17 + (int)uVar20) < iVar1) {
      do {
        iVar7 = (int)uVar20;
        pvVar9 = (void *)((long)pvVar9 + 8);
        iVar6 = compstrp(&ptemp,pvVar9);
        iVar8 = iVar7;
        if (iVar6 != 0) break;
        uVar20 = (ulong)(iVar7 + 1);
        iVar8 = iVar1 - uVar17;
      } while ((int)(uVar17 + iVar7 + 1) < iVar1);
    }
    if ((-1 < (int)uVar17) && (0 < iVar8)) {
      ppuVar21 = __ctype_b_loc();
      uVar20 = (ulong)uVar17;
      do {
        pFVar3 = ppFVar2[uVar20];
        sVar24 = strlen(temp);
        if ((*(byte *)((long)*ppuVar21 + (long)pFVar3->kname[sVar24] * 2 + 1) & 8) != 0) {
          sprintf(errmes,"Keyword #%d, %s is not allowed in the Binary table.",
                  (ulong)(uint)hduptr->kwds[uVar20]->kindex);
          wrterr(out,errmes,1);
        }
        uVar20 = uVar20 + 1;
      } while ((int)uVar20 < (int)(iVar8 + uVar17));
    }
  }
  test_colnam(out,hduptr);
  return;
}

Assistant:

void test_bin_ext(fitsfile *infits, 	/* input fits file   */ 
	     FILE*     out,	/* output ascii file */
	     FitsHdu  *hduptr	/* information about header */
            )
{
    FitsKey *pkey;
    int i,j,k,n;
    long l;
    int status = 0;
    char *p;

    int ntdim;
    long tdim[10];
    int repeat, width;
    FitsKey **kwds;
    int numusrkey;
    int mcol, vla, datatype;

    /* The indexed keywords excluded from ascii table */
    char *exlkeys[] = { "TBCOL"}; 
    int nexlkeys = 1;

    kwds = hduptr->kwds;
    numusrkey = hduptr->tkeys;
    mcol = hduptr->ncols;

    /* General extension */ 
    test_ext(infits,out,hduptr);

    /* General table */ 
    test_tbl(infits,out,hduptr);

    /* The XTENSION, BITPIX, NAXIS, NAXISn, TFIELDS, PCOUNT, GCOUNT, TFORMn,  
       TTYPEn keywords  have been checked in CFITSIO */
    
    /*  Check TNULLn keywords */ 
    strcpy(temp,"TNULL");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    for (j = k; j< k + n ; j++){ 
	p = kwds[j]->kname; 
	p += 5;
        if(!isdigit((int)*p)) continue;
	check_int(kwds[j],out);
	i = (int) strtol(p,NULL,10) -1 ;
        if(i< 0 || i >= mcol) {
            sprintf(errmes,
      "Keyword #%d, %s: invalid index %d (> TFIELD = %d).", 
           kwds[j]->kindex,kwds[j]->kname,i+1,mcol); 
            wrterr(out,errmes,1);
            continue;
        }     
        if(strchr(tform[i],'B') == NULL &&  
           strchr(tform[i],'I') == NULL &&  
           strchr(tform[i],'J') == NULL &&  
           strchr(tform[i],'K') == NULL ) { 
            sprintf(errmes,
     "Keyword #%d, %s is used for the column with format \"%s \".", 
            kwds[j]->kindex,kwds[j]->kname,tform[i]); 
            wrterr(out,errmes,2); 
        } 
        l = strtol(kwds[j]->kvalue,NULL,10); 
        if(strchr(tform[i],'B') != NULL && (
            l < 0 || l > 255) ) {
            sprintf(errmes,"Keyword #%d, %s: The value %ld", 
            kwds[j]->kindex,kwds[j]->kname, l); 
            strcat(errmes, " is not in the range of datatype B.");
            wrtwrn(out,errmes,0); 
        }
        l = strtol(kwds[j]->kvalue,NULL,10); 
        if(strchr(tform[i],'I') != NULL && (
            l < -32768 || l > 32767) ) {
            sprintf(errmes,"Keyword #%d, %s: The value %ld", 
            kwds[j]->kindex,kwds[j]->kname, l); 
            strcat(errmes, " is not in the range of datatype I ");
            wrtwrn(out,errmes,0); 
        }
    } 
    
    /*  Check TSCALn keywords */ 
    strcpy(temp,"TSCAL");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    for (j = k; j< k + n ; j++){ 
	p = kwds[j]->kname; 
	p += 5;
        if(!isdigit((int)*p)) continue;
	if (check_flt(kwds[j],out) && strtod(kwds[j]->kvalue,NULL) == 0.0) { 
            sprintf(errmes,"Keyword #%d, %s:",
            kwds[j]->kindex,kwds[j]->kname);
            strcat(errmes,
              "The scaling factor is zero.");
            wrtwrn(out,errmes,0); 
        }
	i = (int) strtol(p,NULL,10) -1 ;
        if(i< 0 || i >= mcol) {
            sprintf(errmes,
      "Keyword #%d, %s: invalid index %d (> TFIELD = %d).", 
            kwds[j]->kindex,kwds[j]->kname,i+1,mcol); 
            wrterr(out,errmes,1);
            continue;
        }     
        if(strchr(tform[i],'A') != NULL ||  
           strchr(tform[i],'L') != NULL ||  
           strchr(tform[i],'X') != NULL ) { 
            sprintf(errmes,
         "Keyword #%d, %s is used in A, L, or X column. ",
            kwds[j]->kindex,kwds[j]->kname); 
            wrterr(out,errmes,1); 
        }
    } 

    /*  Check TZEROn keywords */ 
    strcpy(temp,"TZERO");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    for (j = k; j< k + n ; j++){ 
	p = kwds[j]->kname; 
	p += 5;
        if(!isdigit((int)*p)) continue;
	check_flt(kwds[j],out);
	i = (int) strtol(p,NULL,10) -1 ;
        if(i< 0 || i >= mcol) {
            sprintf(errmes,
      "Keyword #%d, %s: invalid index %d (> TFIELD = %d).", 
            kwds[j]->kindex,kwds[j]->kname,i+1,mcol); 
            wrterr(out,errmes,1);
            continue;
        }     
        if(strchr(tform[i],'A') != NULL &&  
           strchr(tform[i],'L') != NULL &&  
           strchr(tform[i],'X') != NULL ) { 
            sprintf(errmes,
                "Keyword #%d, %s is used in A, L, or X column. ",
            kwds[j]->kindex,kwds[j]->kname); 
            wrterr(out,errmes,1); 
        }
    } 

    /* Check THEAP keyword */   
    hduptr->heap = (hduptr->naxes[0]) * (hduptr->naxes[1]);
    strcpy(temp,"THEAP");
    key_match(tmpkwds,numusrkey,&ptemp,1,&k,&n);  
    if(k > -1) { 
         if(check_int(kwds[k],out))
             hduptr->heap = (int) strtol(hduptr->kwds[k]->kvalue,NULL,10);
         if(!hduptr->pcount) { 
            sprintf( errmes, 
               "Pcount is zero, but keyword THEAP is present at record #%d). ",
	        kwds[k]->kindex);
                wrterr(out,errmes,1); 
         }
    }

    /* if PCOUNT != 0, test that there is at least 1 variable length array column */
    vla = 0;
    if(hduptr->pcount) {
        for (i=0; i< mcol; i++){ 
            if(fits_get_coltype(infits, i+1, &datatype, NULL, NULL, &status)){ 
               sprintf(errmes,"Column #%d: ",i);
 	       wrtferr(out,errmes, &status,2);
            }
            if (datatype < 0) {
	      vla = 1;
	      break;
	    }
	}

	if (vla == 0) {
	    sprintf(errmes,
	    "PCOUNT = %ld, but there are no variable-length array columns.",
	   (long) hduptr->pcount);
            wrtwrn(out,errmes,0);
	} 
    }
      
   
    /* Check TDIMn  keywords */ 
    strcpy(temp,"TDIM");
    key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    for (j = k; j< k + n ; j++){ 
        pkey = kwds[j]; 
	p = pkey->kname; 
	p += 4;
        if(!isdigit((int)*p)) continue;
	check_str(kwds[j],out);
        if(*(pkey->kvalue) == ' ') { 
            sprintf(errmes,"Keyword #%d, %s: TDIM=\"%s\" ", 
                pkey->kindex,pkey->kname,pkey->kvalue); 
            strcat(errmes,
                    "should not have leading space.");
            wrterr(out,errmes,1); 
            continue;
        }
	i = (int) strtol(p,NULL,10) -1 ;
        if(i< 0 || i >= mcol) {
            sprintf(errmes,
      "Keyword #%d, %s: invalid index %d (> TFIELD = %d).", 
            kwds[j]->kindex,kwds[j]->kname,i+1,mcol); 
            wrterr(out,errmes,1);
            continue;
        }     
	if(fits_decode_tdim(infits,pkey->kvalue,i+1,10,&ntdim,tdim, &status)){ 
           sprintf(errmes,"Keyword #%d, %s: ", 
                kwds[j]->kindex,kwds[j]->kname);
	    wrtferr(out,errmes,&status,1);
        } 
    } 

    /* check the local convension "rAw"*/
    for (i = 0; i < hduptr->ncols; i++) { 
	if((p = strchr(tform[i],'A'))==NULL) continue; 
        repeat = (int) strtol(tform[i],NULL,10);
        p++;
	if(!isdigit((int)*p))continue;
	width = (int)strtol(p,NULL,10);
	if(repeat%width != 0)  { 
	    sprintf(errmes,
	 "TFORM %s of column %d: repeat %d is not the multiple of the width %d",
	    tform[i], i+1, repeat, width);
            wrtwrn(out,errmes,0);
        } 
    }
   
    for (i = 0; i < nexlkeys; i++) {
        strcpy(temp,exlkeys[i]);
    	ptemp = temp;
    	key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
        if(k < 0) continue;
        for (j = k; j < k+n; j++) { 
            pkey = hduptr->kwds[j];

	    p = kwds[j]->kname; 
	    p += strlen(temp);
            if(!isdigit((int)*p)) continue;

            sprintf( errmes, 
               "Keyword #%d, %s is not allowed in the Binary table.",
               pkey->kindex,pkey->kname);
            wrterr(out,errmes,1);
        } 
    }
    
    /* check whether the column name is unique */
    test_colnam(out, hduptr);
    return ;
}